

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O1

void ltsqueeze(size_t padsz)

{
  int iVar1;
  short sVar2;
  uintptr_t uVar3;
  anon_union_8_2_974a5362_for_CentralCache_3 aVar4;
  FreeBlock **ppFVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  uint uVar10;
  uint uVar11;
  anon_union_8_2_974a5362_for_CentralCache_3 *paVar12;
  uint *puVar13;
  uint uVar14;
  Chunk **c;
  anon_union_8_2_974a5362_for_CentralCache_3 aVar15;
  anon_union_8_2_974a5362_for_CentralCache_3 *paVar16;
  anon_union_8_2_974a5362_for_CentralCache_3 aVar17;
  ulong uVar18;
  uint *puVar19;
  uint *puVar20;
  undefined1 *__s;
  anon_union_8_2_974a5362_for_CentralCache_3 *paVar21;
  anon_union_8_2_974a5362_for_CentralCache_3 aVar22;
  CentralCache *pCVar23;
  ulong uVar24;
  FreeBlock *additionalBlocksList;
  FreeBlock *firstBatch;
  FreeBlock *freeList;
  FreeBlock *additionalBatchesList;
  char buffer [32768];
  anon_union_8_2_974a5362_for_CentralCache_3 local_8078;
  anon_union_8_2_974a5362_for_CentralCache_3 local_8070;
  uint local_8064;
  anon_union_8_2_974a5362_for_CentralCache_3 local_8060;
  anon_union_8_2_974a5362_for_CentralCache_3 local_8058;
  size_t local_8050;
  size_t local_8048;
  ulong local_8040;
  undefined1 local_8038 [32776];
  
  uVar24 = 0x13;
  local_8050 = padsz;
  do {
    if (0x10000 < centralCache[uVar24].maxChunkAddr - centralCache[uVar24].minChunkAddr) {
      pCVar23 = centralCache + uVar24;
      LOCK();
      iVar1 = pCVar23->lock;
      pCVar23->lock = 1;
      UNLOCK();
      while (iVar1 != 0) {
        do {
        } while (pCVar23->lock != 0);
        LOCK();
        iVar1 = pCVar23->lock;
        pCVar23->lock = 1;
        UNLOCK();
      }
      uVar3 = centralCache[uVar24].minChunkAddr;
      local_8040 = centralCache[uVar24].maxChunkAddr - uVar3;
      if (local_8040 < 0x10001) {
        pCVar23->lock = 0;
      }
      else {
        local_8040 = local_8040 >> 0x10;
        local_8048 = local_8040 * 2 + 2;
        local_8040 = local_8040 * 2;
        local_8064 = centralCache[uVar24].freeListSize;
        local_8070 = (anon_union_8_2_974a5362_for_CentralCache_3)
                     centralCache[uVar24].field_3.firstBatch;
        local_8060 = (anon_union_8_2_974a5362_for_CentralCache_3)centralCache[uVar24].freeList;
        centralCache[uVar24].field_3.firstBatch = (FreeBlock *)0x0;
        centralCache[uVar24].freeList = (FreeBlock *)0x0;
        centralCache[uVar24].freeListSize = 0;
        pCVar23->lock = 0;
        if (local_8040 < 0x7fff) {
          __s = local_8038;
          memset(__s,0,local_8048);
        }
        else {
          pvVar9 = mmap((void *)0x0,local_8048,3,0x22,-1,0);
          __s = (undefined1 *)((long)pvVar9 + 1U & 0xfffffffffffffffe);
        }
        uVar10 = (int)uVar24 - 3;
        uVar10 = (uint)(0xffc0 / (ulong)((uVar10 & 3 | 4) << ((char)(uVar10 >> 2) - 2U & 0x1f)));
        paVar21 = &local_8078;
        if (__s == (undefined1 *)0x0) {
          do {
            paVar12 = (anon_union_8_2_974a5362_for_CentralCache_3 *)((long)paVar21 + 8);
            paVar21 = (anon_union_8_2_974a5362_for_CentralCache_3 *)paVar12->firstBatch;
          } while (paVar12->firstBatch != (FreeBlock *)0x0);
          paVar21 = &local_8060;
          do {
            paVar16 = paVar21;
            paVar21 = (anon_union_8_2_974a5362_for_CentralCache_3 *)paVar16->firstBatch;
          } while ((anon_union_8_2_974a5362_for_CentralCache_3 *)paVar16->firstBatch !=
                   (anon_union_8_2_974a5362_for_CentralCache_3 *)0x0);
          puVar19 = (uint *)0x0;
        }
        else {
          if (local_8070.firstBatch == (FreeBlock *)0x0) {
            puVar19 = (uint *)0x0;
            paVar12 = &local_8070;
          }
          else {
            paVar12 = &local_8070;
            aVar15 = local_8070;
            puVar20 = (uint *)0x0;
            do {
              do {
                uVar18 = (long)aVar15.firstBatch - uVar3 >> 0x10;
                sVar2 = *(short *)(__s + uVar18 * 2);
                *(ushort *)(__s + uVar18 * 2) = sVar2 + 1U;
                puVar19 = puVar20;
                if (uVar10 == (ushort)(sVar2 + 1U)) {
                  puVar19 = (uint *)((ulong)aVar15.firstBatch & 0xffffffffffff0000);
                  if (uVar24 != *puVar19) {
                    __assert_fail("chunk->sizeClass == sizeClass",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                                  ,0x489,"void ltsqueeze(size_t)");
                  }
                  *(uint **)puVar19 = puVar20;
                }
                aVar15.firstBatch = (aVar15.firstBatch)->next;
                puVar20 = puVar19;
              } while (aVar15.firstBatch != (FreeBlock *)0x0);
              aVar15 = (anon_union_8_2_974a5362_for_CentralCache_3)paVar12->firstBatch->nextBatch;
              paVar12 = (anon_union_8_2_974a5362_for_CentralCache_3 *)
                        &paVar12->firstBatch->nextBatch;
            } while (aVar15.firstBatch != (FreeBlock *)0x0);
          }
          paVar16 = &local_8060;
          aVar15 = local_8060;
          while (aVar15.firstBatch != (FreeBlock *)0x0) {
            uVar18 = (long)aVar15.firstBatch - uVar3 >> 0x10;
            sVar2 = *(short *)(__s + uVar18 * 2);
            *(ushort *)(__s + uVar18 * 2) = sVar2 + 1U;
            puVar20 = puVar19;
            if (uVar10 == (ushort)(sVar2 + 1U)) {
              puVar20 = (uint *)((ulong)aVar15.firstBatch & 0xffffffffffff0000);
              if (uVar24 != *puVar20) {
                __assert_fail("chunk->sizeClass == sizeClass",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                              ,0x48b,"void ltsqueeze(size_t)");
              }
              *(uint **)puVar20 = puVar19;
            }
            paVar16 = (anon_union_8_2_974a5362_for_CentralCache_3 *)paVar16->firstBatch;
            puVar19 = puVar20;
            aVar15 = (anon_union_8_2_974a5362_for_CentralCache_3)paVar16->firstBatch;
          }
        }
        if (puVar19 == (uint *)0x0) {
          LOCK();
          iVar1 = pCVar23->lock;
          pCVar23->lock = 1;
          UNLOCK();
          while (iVar1 != 0) {
            do {
            } while (pCVar23->lock != 0);
            LOCK();
            iVar1 = pCVar23->lock;
            pCVar23->lock = 1;
            UNLOCK();
          }
          *paVar12 = centralCache[uVar24].field_3;
          centralCache[uVar24].field_3.firstBatch = (FreeBlock *)local_8070;
          *paVar16 = (anon_union_8_2_974a5362_for_CentralCache_3)centralCache[uVar24].freeList;
          centralCache[uVar24].freeList = (FreeBlock *)local_8060;
          centralCache[uVar24].freeListSize = centralCache[uVar24].freeListSize + local_8064;
          pCVar23->lock = 0;
          if (0x7ffe < local_8040) {
            munmap(__s,local_8048);
          }
        }
        else {
          uVar14 = 0;
          local_8058.firstBatch = (FreeBlock *)0x0;
          local_8078.firstBatch = (FreeBlock *)0x0;
          uVar11 = 0xffffU >> ((byte)(uVar24 >> 2) & 0x1f) & 0xff;
          local_8064 = uVar11;
          paVar21 = &local_8058;
          paVar12 = &local_8070;
          aVar15.firstBatch = (FreeBlock *)&local_8078;
          uVar6 = local_8064;
          aVar4 = local_8060;
          sVar7 = local_8050;
          if (local_8070.firstBatch != (FreeBlock *)0x0) {
            uVar14 = 0;
            paVar12 = &local_8070;
            aVar17 = local_8070;
            aVar22 = local_8070;
            aVar15.firstBatch = (FreeBlock *)&local_8078;
LAB_00134c2d:
            do {
              if (uVar10 == *(ushort *)(__s + ((long)aVar17.firstBatch - uVar3 >> 0x10) * 2)) {
                aVar4 = (anon_union_8_2_974a5362_for_CentralCache_3)(aVar22.firstBatch)->nextBatch;
                do {
                  if (uVar10 == *(ushort *)(__s + ((long)aVar22.firstBatch - uVar3 >> 0x10) * 2)) {
                    aVar22.firstBatch = (aVar22.firstBatch)->next;
                  }
                  else {
                    (aVar15.firstBatch)->next = (FreeBlock *)aVar22;
                    do {
                      aVar15 = aVar22;
                      uVar14 = uVar14 + 1;
                      aVar22.firstBatch = (aVar15.firstBatch)->next;
                      if (uVar14 - uVar11 == 1) {
                        paVar21->firstBatch = (FreeBlock *)local_8078;
                        uVar14 = 0;
                        (local_8078.firstBatch)->nextBatch = (FreeBlock *)0x0;
                        paVar21 = (anon_union_8_2_974a5362_for_CentralCache_3 *)
                                  &(local_8078.firstBatch)->nextBatch;
                        (aVar15.firstBatch)->next = (FreeBlock *)0x0;
                        local_8078.firstBatch = (FreeBlock *)0x0;
                        aVar15.firstBatch = (FreeBlock *)&local_8078;
                        break;
                      }
                      if (aVar22.firstBatch == (FreeBlock *)0x0) {
                        aVar22.firstBatch = (FreeBlock *)0x0;
                        break;
                      }
                    } while (uVar10 != *(ushort *)
                                        (__s + ((long)aVar22.firstBatch - uVar3 >> 0x10) * 2));
                  }
                } while (aVar22.firstBatch != (FreeBlock *)0x0);
                (aVar15.firstBatch)->next = (FreeBlock *)0x0;
                *paVar12 = aVar4;
              }
              else {
                ppFVar5 = &(aVar17.firstBatch)->next;
                aVar17.firstBatch = *ppFVar5;
                if (*ppFVar5 != (FreeBlock *)0x0) goto LAB_00134c2d;
                paVar12 = (anon_union_8_2_974a5362_for_CentralCache_3 *)
                          &(aVar22.firstBatch)->nextBatch;
              }
              aVar17 = (anon_union_8_2_974a5362_for_CentralCache_3)paVar12->firstBatch;
              aVar22 = aVar17;
              uVar6 = local_8064;
              aVar4 = local_8060;
              sVar7 = local_8050;
            } while (aVar17.firstBatch != (FreeBlock *)0x0);
          }
          while (sVar8 = local_8050, uVar11 = local_8064, local_8064 = uVar6, local_8050 = sVar7,
                aVar4.firstBatch != (FreeBlock *)0x0) {
            if (uVar10 == *(ushort *)(__s + ((long)aVar4.firstBatch - uVar3 >> 0x10) * 2)) {
              aVar4.firstBatch = (aVar4.firstBatch)->next;
              local_8050 = sVar8;
              local_8064 = uVar11;
            }
            else {
              (aVar15.firstBatch)->next = (FreeBlock *)aVar4;
              aVar22.firstBatch = (aVar4.firstBatch)->next;
              (aVar4.firstBatch)->next = (FreeBlock *)0x0;
              uVar6 = local_8064;
              if (uVar14 == uVar11) {
                paVar21->firstBatch = (FreeBlock *)local_8078;
                uVar14 = 0;
                (local_8078.firstBatch)->nextBatch = (FreeBlock *)0x0;
                paVar21 = (anon_union_8_2_974a5362_for_CentralCache_3 *)
                          &(local_8078.firstBatch)->nextBatch;
                local_8078.firstBatch = (FreeBlock *)0x0;
                aVar15.firstBatch = (FreeBlock *)&local_8078;
                aVar4.firstBatch = aVar22.firstBatch;
                sVar7 = local_8050;
                local_8050 = sVar8;
                local_8064 = uVar11;
              }
              else {
                uVar14 = uVar14 + 1;
                aVar15 = aVar4;
                aVar4.firstBatch = aVar22.firstBatch;
                sVar7 = local_8050;
                local_8050 = sVar8;
                local_8064 = uVar11;
              }
            }
          }
          *paVar21 = *paVar12;
          paVar12->firstBatch = (FreeBlock *)local_8058;
          LOCK();
          iVar1 = pCVar23->lock;
          pCVar23->lock = 1;
          UNLOCK();
          while (iVar1 != 0) {
            do {
            } while (pCVar23->lock != 0);
            LOCK();
            iVar1 = pCVar23->lock;
            pCVar23->lock = 1;
            UNLOCK();
          }
          local_8060 = local_8078;
          *paVar12 = centralCache[uVar24].field_3;
          centralCache[uVar24].field_3.firstBatch = (FreeBlock *)local_8070;
          (aVar15.firstBatch)->next = centralCache[uVar24].freeList;
          centralCache[uVar24].freeList = (FreeBlock *)local_8060;
          centralCache[uVar24].freeListSize = centralCache[uVar24].freeListSize + uVar14;
          pCVar23->lock = 0;
          if (0x7ffe < local_8040) {
            munmap(__s,local_8048);
          }
          puVar20 = puVar19;
          if (sVar8 != 0) {
            LOCK();
            UNLOCK();
            if (pad.lock != 0) {
              do {
              } while( true );
            }
            if (pad.size < sVar8) {
              do {
                puVar13 = puVar20;
                puVar20 = *(uint **)puVar13;
                pad.size = pad.size + 0x10000;
                if (sVar8 <= pad.size) break;
              } while (puVar20 != (uint *)0x0);
              *(void **)puVar13 = pad.freeChunk;
              pad.freeChunk = puVar19;
            }
            pad.lock = 0;
          }
          while (puVar20 != (uint *)0x0) {
            puVar19 = *(uint **)puVar20;
            munmap(puVar20,0x10000);
            puVar20 = puVar19;
          }
        }
      }
    }
    uVar24 = uVar24 + 1;
    if (uVar24 == 0x104) {
      return;
    }
  } while( true );
}

Assistant:

void ltsqueeze(size_t padsz)
{
	unsigned int sizeClass = get_size_class(2 * sizeof(void*));//skip small chunks because corresponding batches can not be efficiently detached from the central cache (if that becomes relevant, may be it worths to reimplement batches for small chunks from array to linked lists)
	for (; sizeClass < NUMBER_OF_SIZE_CLASSES; sizeClass++)
	{
		CentralCache* cc = &centralCache[sizeClass];
		if (cc->maxChunkAddr - cc->minChunkAddr <= CHUNK_SIZE)//preliminary check without lock (assume that writing to minChunkAddr/maxChunkAddr is atomic)
			continue;

		SPINLOCK_ACQUIRE(&cc->lock);
		if (cc->maxChunkAddr - cc->minChunkAddr <= CHUNK_SIZE) {//quick check for theoretical possibility that at least one chunk is totally free
			SPINLOCK_RELEASE(&cc->lock);
			continue;
		}
		{uintptr_t minChunkAddr = cc->minChunkAddr;
		size_t bufferSize = ((cc->maxChunkAddr - minChunkAddr) / CHUNK_SIZE + 1) * sizeof(short);
		//Quickly detach all batches of the current size class from the central cache
		unsigned int freeListSize = cc->freeListSize;
		FreeBlock* firstBatch = cc->firstBatch, * freeList = cc->freeList;
		cc->firstBatch = NULL;
		cc->freeList = NULL;
		cc->freeListSize = 0;
		SPINLOCK_RELEASE(&cc->lock);

		//1. Find out chunks with only free blocks via a simple counting the number of free blocks in each chunk
		{char buffer[32 * 1024];//enough for 1GB address space
		unsigned short* inChunkFreeBlocks = (unsigned short*)(bufferSize <= sizeof(buffer) ? memset(buffer, 0, bufferSize) : LTALLOC_VMALLOC(bufferSize));
		unsigned int numBlocksInChunk = (CHUNK_SIZE - (/*CHUNK_IS_SMALL ? sizeof(ChunkSm) : */sizeof(Chunk))) / class_to_size(sizeClass);
		FreeBlock** pbatch, * block, ** pblock;
		Chunk* firstFreeChunk = NULL;
		LTALLOC_ASSERT(numBlocksInChunk < (1U << (sizeof(short) * 8)));//in case if CHUNK_SIZE is too big that total count of blocks in it doesn't fit at short type (...may be use static_assert instead?)
		if (inChunkFreeBlocks)//consider VMALLOC can fail
		{
			for (pbatch = &firstBatch; *pbatch; pbatch = &(*pbatch)->nextBatch)
				for (block = *pbatch; block; block = block->next)
#define FREE_BLOCK(block) \
					if (++inChunkFreeBlocks[((uintptr_t)block - minChunkAddr) / CHUNK_SIZE] == numBlocksInChunk)/*chunk is totally free*/\
					{\
						Chunk *chunk = (Chunk*)((uintptr_t)block & ~(CHUNK_SIZE-1));\
						LTALLOC_ASSERT(chunk->sizeClass == sizeClass);/*just in case check before overwriting this info*/\
						*(Chunk**)chunk = firstFreeChunk;/*put nextFreeChunk pointer right at the beginning of Chunk as there are always must be a space for one pointer before first memory block*/\
						firstFreeChunk = chunk;\
					}
					FREE_BLOCK(block)
					for (pblock = &freeList; *pblock; pblock = &(*pblock)->next)
						FREE_BLOCK(*pblock)
#undef FREE_BLOCK
		}
		else {
			for (pbatch = &firstBatch; *pbatch; pbatch = &(*pbatch)->nextBatch);
			for (pblock = &freeList; *pblock; pblock = &(*pblock)->next);
		}

		if (firstFreeChunk)//is anything to release
		{
			//2. Unlink all matching blocks from the corresponding free lists
			FreeBlock* additionalBatchesList = NULL, * additionalBlocksList = NULL, ** abatch = &additionalBatchesList, ** ablock = &additionalBlocksList;
			unsigned int additionalBlocksListSize = 0, batchSize = batch_size(sizeClass) + 1;
			for (pbatch = &firstBatch; *pbatch;)
			{
				for (block = *pbatch; block; block = block->next)
					if (inChunkFreeBlocks[((uintptr_t)block - minChunkAddr) / CHUNK_SIZE] == numBlocksInChunk)//if at least one block belongs to a releasable chunk, then this batch should be handled specially
					{
						FreeBlock* nextBatch = (*pbatch)->nextBatch;
						for (block = *pbatch; block;)//re-add blocks of not-for-release chunks and organize them into another batches' list (to join it with the main later)
							if (inChunkFreeBlocks[((uintptr_t)block - minChunkAddr) / CHUNK_SIZE] != numBlocksInChunk)//skip matching-for-release blocks
							{
								*ablock = block;
								do//this loop needed only to minimize memory write operations, otherwise a simpler approach could be used (like in the next loop below)
								{
									ablock = &block->next;
									block = block->next;
									if (++additionalBlocksListSize == batchSize)
									{
										abatch = &(*abatch = additionalBlocksList)->nextBatch;
										*abatch = NULL;
										*ablock = NULL;
										ablock = &additionalBlocksList;
										additionalBlocksList = NULL;
										additionalBlocksListSize = 0;
										break;//to force *ablock = block; for starting a new batch
									}
								} while (block && inChunkFreeBlocks[((uintptr_t)block - minChunkAddr) / CHUNK_SIZE] != numBlocksInChunk);
							}
							else
								block = block->next;
						*ablock = NULL;
						*pbatch = nextBatch;//unlink batch
						goto continue_;
					}
				pbatch = &(*pbatch)->nextBatch;
			continue_:;
			}
			for (block = freeList; block;)
				if (inChunkFreeBlocks[((uintptr_t)block - minChunkAddr) / CHUNK_SIZE] != numBlocksInChunk)
				{
					//*pblock = (*pblock)->next, freeListSize--;//unlink block
					ablock = &(*ablock = block)->next;
					block = block->next;
					*ablock = NULL;
					if (++additionalBlocksListSize == batchSize)
					{
						abatch = &(*abatch = additionalBlocksList)->nextBatch;
						*abatch = NULL;
						ablock = &additionalBlocksList;
						additionalBlocksList = NULL;
						additionalBlocksListSize = 0;
					}
				}
				else
					block = block->next;
			//Add additional lists
			*abatch = *pbatch;
			*pbatch = additionalBatchesList;
			pblock = ablock;
			freeList = additionalBlocksList;
			freeListSize = additionalBlocksListSize;

			//Return back all left not-for-release blocks to the central cache as quickly as possible (as other threads may want to allocate a new memory)
#define GIVE_LISTS_BACK_TO_CC \
			SPINLOCK_ACQUIRE(&cc->lock);\
			*pbatch = cc->firstBatch;\
			cc->firstBatch = firstBatch;\
			*pblock = cc->freeList;\
			cc->freeList = freeList;\
			cc->freeListSize += freeListSize;\
			SPINLOCK_RELEASE(&cc->lock);\
			if (bufferSize > sizeof(buffer)) LTALLOC_VMFREE(inChunkFreeBlocks, bufferSize);//this better to do before 3. as kernel is likely optimized for release of just allocated range
			GIVE_LISTS_BACK_TO_CC

				if (padsz)
				{
					SPINLOCK_ACQUIRE(&pad.lock);
					if (pad.size < padsz)
					{
						Chunk* first = firstFreeChunk, ** c;
						do//put off free chunks up to a specified pad size
						{
							c = (Chunk**)firstFreeChunk;
							firstFreeChunk = *c;
							pad.size += CHUNK_SIZE;
						} while (pad.size < padsz && firstFreeChunk);
						*c = (Chunk*)pad.freeChunk;
						pad.freeChunk = first;
					}
					SPINLOCK_RELEASE(&pad.lock);
				}

			//3. Return memory to the system
			while (firstFreeChunk)
			{
				Chunk* nextFreeChunk = *(Chunk**)firstFreeChunk;
				LTALLOC_VMFREE(firstFreeChunk, CHUNK_SIZE);
				firstFreeChunk = nextFreeChunk;
			}
		}
		else//nothing to release - just return batches back to the central cache
		{
			GIVE_LISTS_BACK_TO_CC
#undef GIVE_LISTS_BACK_TO_CC
		}}}
	}
}